

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O0

void __thiscall UDUNITS_acceptedNameSymbols_Test::TestBody(UDUNITS_acceptedNameSymbols_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  XMLNode *pXVar5;
  uint64_t uVar6;
  ostream *poVar7;
  char *in_R9;
  precise_unit pVar8;
  AssertHelper local_4c0;
  Message local_4b8;
  int local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar;
  unit local_48c;
  allocator local_481;
  string local_480;
  undefined1 local_460 [8];
  precise_unit symUnit;
  char *symString;
  XMLElement *sym;
  unit local_434;
  allocator local_429;
  string local_428;
  undefined1 local_408 [8];
  precise_unit nameUnit;
  char *sname;
  XMLElement *name;
  undefined1 local_3c8 [8];
  precise_unit definitionUnit;
  string local_3b0 [8];
  string def;
  XMLElement *pXStack_388;
  int failConvert;
  XMLElement *cs;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_;
  XMLError local_31c;
  undefined1 local_318 [4];
  XMLError err;
  XMLDocument doc;
  UDUNITS_acceptedNameSymbols_Test *this_local;
  
  doc._commentPool._120_8_ = this;
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_318,true,PRESERVE_WHITESPACE);
  local_31c = tinyxml2::XMLDocument::LoadFile
                        ((XMLDocument *)local_318,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                        );
  local_341 = local_31c == XML_SUCCESS;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pMVar2 = testing::Message::operator<<(&local_350,&local_31c);
    pMVar2 = testing::Message::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)local_340,(AssertionResult *)0x1d3e4c,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  if (bVar1) {
    pXVar4 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)local_318,"unit-system");
    pXStack_388 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"unit");
    def.field_2._12_4_ = 0;
    while (pXStack_388 != (XMLElement *)0x0) {
      pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXStack_388->super_XMLNode,"def");
      pXVar5 = tinyxml2::XMLNode::FirstChild(&pXVar4->super_XMLNode);
      pcVar3 = tinyxml2::XMLNode::Value(pXVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3b0,pcVar3,(allocator *)((long)&definitionUnit.commodity_ + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&definitionUnit.commodity_ + 3));
      std::__cxx11::string::string((string *)&name,local_3b0);
      uVar6 = units::getDefaultFlags();
      pVar8 = units::unit_from_string((string *)&name,uVar6);
      definitionUnit.multiplier_ = pVar8._8_8_;
      local_3c8 = (undefined1  [8])pVar8.multiplier_;
      std::__cxx11::string::~string((string *)&name);
      bVar1 = units::is_error((precise_unit *)local_3c8);
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"unable to convert ");
        poVar7 = std::operator<<(poVar7,local_3b0);
        std::operator<<(poVar7," into a valid unit \n");
        def.field_2._12_4_ = def.field_2._12_4_ + 1;
      }
      else {
        pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXStack_388->super_XMLNode,"name");
        if (pXVar4 != (XMLElement *)0x0) {
          pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"singular");
          pXVar5 = tinyxml2::XMLNode::FirstChild(&pXVar4->super_XMLNode);
          pcVar3 = tinyxml2::XMLNode::Value(pXVar5);
          nameUnit._8_8_ = pcVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_428,pcVar3,&local_429);
          uVar6 = units::getDefaultFlags();
          pVar8 = units::unit_from_string(&local_428,uVar6);
          nameUnit.multiplier_ = pVar8._8_8_;
          local_408 = (undefined1  [8])pVar8.multiplier_;
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator((allocator<char> *)&local_429);
          bVar1 = units::is_error((precise_unit *)local_408);
          if (bVar1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar7 = std::operator<<(poVar7,(char *)nameUnit._8_8_);
            std::operator<<(poVar7," into a valid unit \n");
            def.field_2._12_4_ = def.field_2._12_4_ + 1;
          }
          else {
            local_434 = units::unit_cast((precise_unit *)local_408);
            register0x00000000 = units::unit_cast((precise_unit *)local_3c8);
            bVar1 = units::unit::operator!=(&local_434,(unit *)((long)&sym + 4));
            if (bVar1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
              poVar7 = std::operator<<(poVar7,(char *)nameUnit._8_8_);
              poVar7 = std::operator<<(poVar7," and ");
              poVar7 = std::operator<<(poVar7,local_3b0);
              std::operator<<(poVar7,"\n");
              def.field_2._12_4_ = def.field_2._12_4_ + 1;
            }
          }
        }
        for (symString = (char *)tinyxml2::XMLNode::FirstChildElement
                                           (&pXStack_388->super_XMLNode,"symbol");
            symString != (char *)0x0;
            symString = (char *)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)symString,"symbol")
            ) {
          pXVar5 = tinyxml2::XMLNode::FirstChild((XMLNode *)symString);
          pcVar3 = tinyxml2::XMLNode::Value(pXVar5);
          symUnit._8_8_ = pcVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_480,pcVar3,&local_481);
          uVar6 = units::getDefaultFlags();
          pVar8 = units::unit_from_string(&local_480,uVar6);
          symUnit.multiplier_ = pVar8._8_8_;
          local_460 = (undefined1  [8])pVar8.multiplier_;
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
          bVar1 = units::is_error((precise_unit *)local_460);
          if (bVar1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar7 = std::operator<<(poVar7,(char *)symUnit._8_8_);
            std::operator<<(poVar7," into a valid unit \n");
            def.field_2._12_4_ = def.field_2._12_4_ + 1;
          }
          else {
            local_48c = units::unit_cast((precise_unit *)local_460);
            register0x00000000 = units::unit_cast((precise_unit *)local_3c8);
            bVar1 = units::unit::operator!=
                              (&local_48c,
                               (unit *)((long)&gtest_ar.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 4));
            if (bVar1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"symbol and unit do not match ");
              poVar7 = std::operator<<(poVar7,(char *)symUnit._8_8_);
              poVar7 = std::operator<<(poVar7," and ");
              poVar7 = std::operator<<(poVar7,local_3b0);
              std::operator<<(poVar7,"\n");
              def.field_2._12_4_ = def.field_2._12_4_ + 1;
            }
          }
        }
      }
      pXStack_388 = tinyxml2::XMLNode::NextSiblingElement(&pXStack_388->super_XMLNode,"unit");
      std::__cxx11::string::~string(local_3b0);
    }
    local_4ac = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_4a8,"failConvert","0",(int *)(def.field_2._M_local_buf + 0xc),
               &local_4ac);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
    if (!bVar1) {
      testing::Message::Message(&local_4b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_4c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x48,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4c0);
      testing::Message::~Message(&local_4b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  }
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_318);
  return;
}

Assistant:

TEST(UDUNITS, acceptedNameSymbols)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);
        if (is_error(definitionUnit)) {
            std::cout << "unable to convert " << def << " into a valid unit \n";
            ++failConvert;
        } else {
            auto name = cs->FirstChildElement("name");
            if (name != nullptr) {
                auto sname =
                    name->FirstChildElement("singular")->FirstChild()->Value();
                auto nameUnit = units::unit_from_string(sname);
                if (is_error(nameUnit)) {
                    std::cout << "unable to convert " << sname
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            // check for symbols
            auto sym = cs->FirstChildElement("symbol");
            while (sym != nullptr) {
                auto symString = sym->FirstChild()->Value();
                auto symUnit = units::unit_from_string(symString);
                if (is_error(symUnit)) {
                    std::cout << "unable to convert " << symString
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                        std::cout << "symbol and unit do not match "
                                  << symString << " and " << def << "\n";
                        ++failConvert;
                    }
                }
                sym = sym->NextSiblingElement("symbol");
            }
        }
        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}